

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2ExternalSubset(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  undefined8 uVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  xmlParserInputPtr input;
  xmlDtdPtr pxVar8;
  void *pvVar9;
  xmlChar *pxVar10;
  xmlParserInputPtr input_00;
  ulong uVar11;
  ulong uVar12;
  undefined4 local_48;
  undefined4 uStack_44;
  
  if (SystemID == (xmlChar *)0x0 || ctx == (void *)0x0) {
    return;
  }
  if ((*(byte *)((long)ctx + 0x236) & 0x80) != 0) {
    return;
  }
  if ((*(int *)((long)ctx + 0x9c) == 0) && (*(int *)((long)ctx + 0x1b0) == 0)) {
    return;
  }
  if (*(int *)((long)ctx + 0x18) == 0) {
    return;
  }
  if (*(long *)((long)ctx + 0x10) == 0) {
    return;
  }
  if (*ctx == 0) {
    return;
  }
  pcVar2 = *(code **)(*ctx + 0x20);
  if (pcVar2 == (code *)0x0) {
    return;
  }
  input = (xmlParserInputPtr)(*pcVar2)(*(undefined8 *)((long)ctx + 8),ExternalID,SystemID);
  if (input == (xmlParserInputPtr)0x0) {
    return;
  }
  pxVar8 = xmlNewDtd(*(xmlDocPtr *)((long)ctx + 0x10),name,ExternalID,SystemID);
  if (pxVar8 == (xmlDtdPtr)0x0) {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
    xmlFreeInputStream(input);
    return;
  }
  uVar3 = *(undefined8 *)((long)ctx + 0x28);
  uVar4 = *(undefined8 *)((long)ctx + 0x38);
  uVar1 = *(undefined8 *)((long)ctx + 0x40);
  uVar5 = *(undefined8 *)((long)ctx + 0x48);
  *(undefined8 *)((long)ctx + 0x28) = 0;
  pvVar9 = (*xmlMalloc)(0x28);
  *(void **)((long)ctx + 0x48) = pvVar9;
  if (pvVar9 == (void *)0x0) {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  }
  else {
    *(undefined8 *)((long)ctx + 0x40) = 0x500000000;
    *(undefined8 *)((long)ctx + 0x38) = 0;
    iVar7 = xmlCtxtPushInput((xmlParserCtxtPtr)ctx,input);
    if (-1 < iVar7) {
      if (input->filename == (char *)0x0) {
        pxVar10 = xmlCanonicPath(SystemID);
        input->filename = (char *)pxVar10;
      }
      input->line = 1;
      input->col = 1;
      pxVar10 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 0x20);
      input->base = pxVar10;
      input->cur = pxVar10;
      input->free = (xmlParserInputDeallocate)0x0;
      xmlParseExternalSubset((xmlParserCtxtPtr)ctx,ExternalID,SystemID);
      iVar7 = *(int *)((long)ctx + 0x40);
      while (1 < iVar7) {
        input_00 = xmlCtxtPopInput((xmlParserCtxtPtr)ctx);
        xmlFreeInputStream(input_00);
        iVar7 = *(int *)((long)ctx + 0x40);
      }
      lVar6 = *(long *)((long)ctx + 0x38);
      uVar12 = *(long *)(lVar6 + 0x20) - *(long *)(lVar6 + 0x18);
      uVar11 = 0xffffffffffffffff;
      if (!CARRY8(uVar12,*(ulong *)(lVar6 + 0x40))) {
        uVar11 = uVar12 + *(ulong *)(lVar6 + 0x40);
      }
      if (CARRY8(uVar11,*(ulong *)((long)ctx + 0x2c0))) {
        *(undefined8 *)((long)ctx + 0x2c0) = 0xffffffffffffffff;
      }
      else {
        *(ulong *)((long)ctx + 0x2c0) = uVar11 + *(ulong *)((long)ctx + 0x2c0);
      }
    }
  }
  xmlFreeInputStream(input);
  (*xmlFree)(*(void **)((long)ctx + 0x48));
  *(undefined8 *)((long)ctx + 0x38) = uVar4;
  local_48 = (undefined4)uVar1;
  uStack_44 = (undefined4)((ulong)uVar1 >> 0x20);
  *(undefined4 *)((long)ctx + 0x40) = local_48;
  *(undefined4 *)((long)ctx + 0x44) = uStack_44;
  *(undefined8 *)((long)ctx + 0x48) = uVar5;
  pxVar10 = *(xmlChar **)((long)ctx + 0x28);
  if (pxVar10 != (xmlChar *)0x0) {
    if (*(xmlDictPtr *)((long)ctx + 0x1c8) != (xmlDictPtr)0x0) {
      iVar7 = xmlDictOwns(*(xmlDictPtr *)((long)ctx + 0x1c8),pxVar10);
      if (iVar7 != 0) goto LAB_001448d3;
      pxVar10 = *(xmlChar **)((long)ctx + 0x28);
    }
    (*xmlFree)(pxVar10);
  }
LAB_001448d3:
  *(undefined8 *)((long)ctx + 0x28) = uVar3;
  return;
}

Assistant:

void
xmlSAX2ExternalSubset(void *ctx, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    if (ctx == NULL) return;
    if ((SystemID != NULL) &&
        ((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
        (((ctxt->validate) || (ctxt->loadsubset)) &&
	 (ctxt->wellFormed && ctxt->myDoc))) {
	/*
	 * Try to fetch and parse the external subset.
	 */
	xmlParserInputPtr oldinput;
	int oldinputNr;
	int oldinputMax;
	xmlParserInputPtr *oldinputTab;
	xmlParserInputPtr input = NULL;
	const xmlChar *oldencoding;
        unsigned long consumed;
        size_t buffered;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        int inputMax = 1;
#else
        int inputMax = 5;
#endif

	/*
	 * Ask the Entity resolver to load the damn thing
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	    input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                        SystemID);
	if (input == NULL) {
	    return;
	}

	if (xmlNewDtd(ctxt->myDoc, name, ExternalID, SystemID) == NULL) {
            xmlSAX2ErrMemory(ctxt);
            xmlFreeInputStream(input);
            return;
        }

	/*
	 * make sure we won't destroy the main document context
	 */
	oldinput = ctxt->input;
	oldinputNr = ctxt->inputNr;
	oldinputMax = ctxt->inputMax;
	oldinputTab = ctxt->inputTab;
	oldencoding = ctxt->encoding;
	ctxt->encoding = NULL;

	ctxt->inputTab = xmlMalloc(inputMax * sizeof(xmlParserInputPtr));
	if (ctxt->inputTab == NULL) {
	    xmlSAX2ErrMemory(ctxt);
            goto error;
	}
	ctxt->inputNr = 0;
	ctxt->inputMax = inputMax;
	ctxt->input = NULL;
	if (xmlCtxtPushInput(ctxt, input) < 0)
            goto error;

	if (input->filename == NULL)
	    input->filename = (char *) xmlCanonicPath(SystemID);
	input->line = 1;
	input->col = 1;
	input->base = ctxt->input->cur;
	input->cur = ctxt->input->cur;
	input->free = NULL;

	/*
	 * let's parse that entity knowing it's an external subset.
	 */
	xmlParseExternalSubset(ctxt, ExternalID, SystemID);

        /*
	 * Free up the external entities
	 */

	while (ctxt->inputNr > 1)
	    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

        consumed = ctxt->input->consumed;
        buffered = ctxt->input->cur - ctxt->input->base;
        if (buffered > ULONG_MAX - consumed)
            consumed = ULONG_MAX;
        else
            consumed += buffered;
        if (consumed > ULONG_MAX - ctxt->sizeentities)
            ctxt->sizeentities = ULONG_MAX;
        else
            ctxt->sizeentities += consumed;

error:
	xmlFreeInputStream(input);
        xmlFree(ctxt->inputTab);

	/*
	 * Restore the parsing context of the main entity
	 */
	ctxt->input = oldinput;
	ctxt->inputNr = oldinputNr;
	ctxt->inputMax = oldinputMax;
	ctxt->inputTab = oldinputTab;
	if ((ctxt->encoding != NULL) &&
	    ((ctxt->dict == NULL) ||
	     (!xmlDictOwns(ctxt->dict, ctxt->encoding))))
	    xmlFree((xmlChar *) ctxt->encoding);
	ctxt->encoding = oldencoding;
	/* ctxt->wellFormed = oldwellFormed; */
    }
}